

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O3

void __thiscall UDMFParser::ProcessLineDefs(UDMFParser *this)

{
  double *pdVar1;
  double dVar2;
  vertex_t *pvVar3;
  vertex_t *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  int iVar9;
  line_t *plVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  uint uVar15;
  int iVar16;
  DWORD *pDVar17;
  DWORD *pDVar18;
  short *alpha;
  byte bVar19;
  int local_60;
  short tempalpha [2];
  
  bVar19 = 0;
  local_60 = 0;
  uVar15 = 0;
  if ((this->ParsedLines).Count != 0) {
    local_60 = 0;
    uVar11 = 0;
    iVar9 = 0;
    do {
      uVar15 = (uint)uVar11;
      plVar10 = (this->ParsedLines).Array;
      pvVar3 = plVar10[uVar11].v1;
      pvVar4 = plVar10[uVar11].v2;
      if (((long)pvVar3 < (long)numvertexes) &&
         (-1 < (long)((ulong)pvVar3 | (ulong)pvVar4) && (long)pvVar4 < (long)numvertexes)) {
        if (pvVar3 != pvVar4) {
          dVar2 = vertexes[(long)pvVar3].p.X;
          if ((((dVar2 != vertexes[(long)pvVar4].p.X) ||
               (NAN(dVar2) || NAN(vertexes[(long)pvVar4].p.X))) ||
              (dVar2 = vertexes[(long)pvVar3].p.Y, pdVar1 = &vertexes[(long)pvVar4].p.Y,
              dVar2 != *pdVar1)) || (NAN(dVar2) || NAN(*pdVar1))) {
            plVar10 = plVar10 + uVar11;
            plVar10->v1 = vertexes + (long)pvVar3;
            plVar10->v2 = vertexes + (long)pvVar4;
            local_60 = ((local_60 - (uint)(plVar10->sidedef[0] == (side_t *)0x0)) + 2) -
                       (uint)(plVar10->sidedef[1] == (side_t *)0x0);
            TArray<int,_int>::Grow(&linemap,1);
            linemap.Array[linemap.Count] = uVar15 + iVar9;
            linemap.Count = linemap.Count + 1;
            uVar11 = (ulong)(uVar15 + 1);
            goto LAB_0057f1bc;
          }
        }
        Printf("Removing 0-length line %d\n",(ulong)(uVar15 + iVar9));
        uVar8 = (this->ParsedLines).Count;
        if (uVar15 < uVar8) {
          uVar8 = uVar8 - 1;
          (this->ParsedLines).Count = uVar8;
          if (uVar15 <= uVar8 && uVar8 - uVar15 != 0) {
            plVar10 = (this->ParsedLines).Array;
            memmove(plVar10 + uVar11,plVar10 + (uVar15 + 1),(ulong)(uVar8 - uVar15) * 0x98);
          }
        }
        ForceNodeBuild = true;
        iVar9 = iVar9 + 1;
      }
      else {
        I_Error("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.",
                (ulong)(uVar15 + iVar9));
      }
LAB_0057f1bc:
      uVar15 = (this->ParsedLines).Count;
    } while ((uint)uVar11 < uVar15);
  }
  numsides = local_60;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(int)uVar15;
  uVar11 = SUB168(auVar5 * ZEXT816(0x98),0);
  if (SUB168(auVar5 * ZEXT816(0x98),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  numlines = uVar15;
  lines = (line_t *)operator_new__(uVar11);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)local_60;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0xd8),8) == 0) {
    uVar11 = SUB168(auVar6 * ZEXT816(0xd8),0);
  }
  sides = (side_t *)operator_new__(uVar11);
  if ((int)uVar15 < 1) {
    iVar16 = 0;
    iVar9 = local_60;
  }
  else {
    lVar13 = 0;
    iVar16 = 0;
    do {
      tempalpha[0] = -0x8000;
      tempalpha[1] = -0x8000;
      plVar10 = (this->ParsedLines).Array + lVar13;
      pvVar3 = plVar10->v2;
      pDVar18 = &lines[lVar13].flags;
      ((line_t *)(pDVar18 + -8))->v1 = plVar10->v1;
      *(vertex_t **)(pDVar18 + -6) = pvVar3;
      dVar2 = (plVar10->delta).Y;
      ((DVector2 *)(pDVar18 + -4))->X = (plVar10->delta).X;
      *(double *)(pDVar18 + -2) = dVar2;
      pDVar17 = &plVar10->flags;
      for (lVar12 = 0xf; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined8 *)pDVar18 = *(undefined8 *)pDVar17;
        pDVar17 = pDVar17 + ((ulong)bVar19 * -2 + 1) * 2;
        pDVar18 = pDVar18 + (ulong)bVar19 * -4 + 2;
      }
      alpha = tempalpha;
      lVar12 = 0;
      bVar7 = true;
      do {
        bVar14 = bVar7;
        if (lines[lVar13].sidedef[lVar12] != (side_t *)0x0) {
          iVar9 = (int)lines[lVar13].sidedef[lVar12];
          if (local_60 < iVar9) {
            lines[lVar13].sidedef[lVar12] = (side_t *)0x0;
          }
          else {
            iVar9 = iVar9 + -1;
            memcpy(sides + iVar16,(this->ParsedSides).Array + iVar9,0xd4);
            sides[iVar16].linedef = lines + lVar13;
            sides[iVar16].sector = sectors + (long)sides[iVar16].sector;
            lines[lVar13].sidedef[lVar12] = sides + iVar16;
            P_ProcessSideTextures
                      ((bool)(this->isExtended ^ 1),sides + iVar16,sides[iVar16].sector,
                       (this->ParsedSideTextures).Array + iVar9,lines[lVar13].special,
                       lines[lVar13].args[0],alpha,this->missingTex);
            iVar16 = iVar16 + 1;
          }
        }
        alpha = tempalpha + 1;
        lVar12 = 1;
        bVar7 = false;
      } while (bVar14);
      P_AdjustLine(lines + lVar13);
      P_FinishLoadingLineDef(lines + lVar13,(int)tempalpha[0]);
      lVar13 = lVar13 + 1;
      iVar9 = numsides;
    } while (lVar13 < numlines);
  }
  if (iVar9 < iVar16) {
    __assert_fail("side <= numsides",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                  ,0x6ec,"void UDMFParser::ProcessLineDefs()");
  }
  if (iVar16 < iVar9) {
    Printf("Map had %d invalid side references\n");
    numsides = iVar16;
  }
  return;
}

Assistant:

void ProcessLineDefs()
	{
		int sidecount = 0;
		for(unsigned i = 0, skipped = 0; i < ParsedLines.Size();)
		{
			// Relocate the vertices
			intptr_t v1i = intptr_t(ParsedLines[i].v1);
			intptr_t v2i = intptr_t(ParsedLines[i].v2);

			if (v1i >= numvertexes || v2i >= numvertexes || v1i < 0 || v2i < 0)
			{
				I_Error ("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.", i+skipped, v1i, v2i, numvertexes);
			}
			else if (v1i == v2i ||
				(vertexes[v1i].fX() == vertexes[v2i].fX() && vertexes[v1i].fY() == vertexes[v2i].fY()))
			{
				Printf ("Removing 0-length line %d\n", i+skipped);
				ParsedLines.Delete(i);
				ForceNodeBuild = true;
				skipped++;
			}
			else
			{
				ParsedLines[i].v1 = &vertexes[v1i];
				ParsedLines[i].v2 = &vertexes[v2i];

				if (ParsedLines[i].sidedef[0] != NULL)
					sidecount++;
				if (ParsedLines[i].sidedef[1] != NULL)
					sidecount++;
				linemap.Push(i+skipped);
				i++;
			}
		}
		numlines = ParsedLines.Size();
		numsides = sidecount;
		lines = new line_t[numlines];
		sides = new side_t[numsides];
		int line, side;

		for(line = 0, side = 0; line < numlines; line++)
		{
			short tempalpha[2] = { SHRT_MIN, SHRT_MIN };

			lines[line] = ParsedLines[line];

			for(int sd = 0; sd < 2; sd++)
			{
				if (lines[line].sidedef[sd] != NULL)
				{
					int mapside = int(intptr_t(lines[line].sidedef[sd]))-1;
					if (mapside < sidecount)
					{
						sides[side] = ParsedSides[mapside];
						sides[side].linedef = &lines[line];
						sides[side].sector = &sectors[intptr_t(sides[side].sector)];
						lines[line].sidedef[sd] = &sides[side];

						P_ProcessSideTextures(!isExtended, &sides[side], sides[side].sector, &ParsedSideTextures[mapside],
							lines[line].special, lines[line].args[0], &tempalpha[sd], missingTex);

						side++;
					}
					else
					{
						lines[line].sidedef[sd] = NULL;
					}
				}
			}

			P_AdjustLine(&lines[line]);
			P_FinishLoadingLineDef(&lines[line], tempalpha[0]);
		}
		assert(side <= numsides);
		if (side < numsides)
		{
			Printf("Map had %d invalid side references\n", numsides - side);
			numsides = side;
		}
	}